

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

int __thiscall
diy::AMRLink::clone(AMRLink *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  AMRLink *unaff_retaddr;
  
  pvVar1 = operator_new(0x1a0);
  AMRLink(unaff_retaddr,this);
  return (int)pvVar1;
}

Assistant:

Link*         clone() const override                  { return new AMRLink(*this); }